

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

EOPLL_RateConv * EOPLL_RateConv_new(double f_inp,double f_out,int ch)

{
  EOPLL_RateConv *pEVar1;
  int32_t **ppiVar2;
  int32_t *piVar3;
  int16_t *piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  pEVar1 = (EOPLL_RateConv *)malloc(0x28);
  pEVar1->ch = ch;
  dVar8 = f_inp / f_out;
  pEVar1->f_ratio = dVar8;
  ppiVar2 = (int32_t **)malloc((long)ch * 8);
  pEVar1->buf = ppiVar2;
  uVar6 = 0;
  uVar5 = (ulong)(uint)ch;
  if (ch < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    piVar3 = (int32_t *)malloc(0x40);
    ppiVar2[uVar6] = piVar3;
  }
  piVar4 = (int16_t *)malloc(0x1000);
  pEVar1->sinc_table = piVar4;
  for (lVar7 = 0; lVar7 != 0x800; lVar7 = lVar7 + 1) {
    dVar9 = (double)(int)lVar7 * 0.00390625;
    if (f_inp <= f_out) {
      dVar9 = windowed_sinc(dVar9);
      dVar9 = dVar9 * 4096.0;
    }
    else {
      dVar9 = windowed_sinc(dVar9 / dVar8);
      dVar9 = (dVar9 * 4096.0) / dVar8;
    }
    piVar4[lVar7] = (int16_t)(int)dVar9;
  }
  return pEVar1;
}

Assistant:

EOPLL_RateConv *EOPLL_RateConv_new(double f_inp, double f_out, int ch) {
  EOPLL_RateConv *conv = malloc(sizeof(EOPLL_RateConv));
  int i;

  conv->ch = ch;
  conv->f_ratio = f_inp / f_out;
  conv->buf = malloc(sizeof(void *) * ch);
  for (i = 0; i < ch; i++) {
    conv->buf[i] = malloc(sizeof(conv->buf[0][0]) * LW);
  }

  /* create sinc_table for positive 0 <= x < LW/2 */
  conv->sinc_table = malloc(sizeof(conv->sinc_table[0]) * SINC_RESO * LW / 2);
  for (i = 0; i < SINC_RESO * LW / 2; i++) {
    const double x = (double)i / SINC_RESO;
    if (f_out < f_inp) {
      /* for downsampling */
      conv->sinc_table[i] = (int16_t)((1 << SINC_AMP_BITS) * windowed_sinc(x / conv->f_ratio) / conv->f_ratio);
    } else {
      /* for upsampling */
      conv->sinc_table[i] = (int16_t)((1 << SINC_AMP_BITS) * windowed_sinc(x));
    }
  }

  return conv;
}